

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  __uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true> __s;
  ostream *poVar2;
  uint i;
  ulong uVar3;
  uint numThreads;
  uint local_19c;
  unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_> frame;
  tuple<pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_> local_188;
  reference_wrapper<pm::PinHole> local_180;
  reference_wrapper<pm::GlobalTrace> local_178;
  reference_wrapper<pm::World> local_170;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  GlobalTrace tracer;
  World world;
  PinHole local_90;
  
  std::operator<<((ostream *)&std::cout,"Poor Man\'s Tracer \n\n");
  std::ostream::flush();
  std::operator<<((ostream *)&std::cout,"Setting up the scene...\n");
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  __s.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
  super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (__uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>)operator_new__(0xa8c000)
  ;
  memset((void *)__s.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
                 super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
                 super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl,0,0xa8c000);
  frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
  super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       __s.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
       super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
       super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl;
  pm::World::World(&world);
  tracer.super_Tracer.type_ = GLOBALTRACE;
  tracer.super_Tracer._vptr_Tracer = (_func_int **)&PTR__Tracer_00118a18;
  setupCornellBox(&world);
  world.viewplane_.pixelSize_ = 0.004;
  validateWorld(&world);
  pm::PinHole::PinHole(&local_90);
  local_90.super_Camera.up_.z = 0.0;
  local_90.super_Camera.eye_.x = 278.0;
  local_90.super_Camera.eye_.y = 273.0;
  local_90.super_Camera.eye_.z = -800.0;
  local_90.super_Camera.lookAt_.x = 278.0;
  local_90.super_Camera.lookAt_.y = 273.0;
  local_90.super_Camera.lookAt_.z = 0.0;
  local_90.super_Camera.up_.x = 0.0;
  local_90.super_Camera.up_.y = 1.0;
  local_90.distance_ = 4.0;
  pm::Camera::computeUvw(&local_90.super_Camera);
  uVar1 = std::thread::hardware_concurrency();
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numThreads = uVar1;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,(ulong)uVar1);
  std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Scene setting time: ");
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar2,"ms\n");
  std::ostream::flush();
  poVar2 = std::operator<<((ostream *)&std::cout,"Scene statistics: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," objects, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," materials, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," lights, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," samplers\n");
  std::ostream::flush();
  std::operator<<((ostream *)&std::cout,"Rendering started");
  std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cout," with ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," threads...\n");
  std::ostream::flush();
  for (local_19c = 0; local_19c < uVar1; local_19c = local_19c + 1) {
    local_170._M_data = &world;
    local_178._M_data = &tracer;
    local_180._M_data = &local_90;
    local_188.super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
    super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>)
         (_Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>)
         frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
         super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
         super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(int,int,pm::World&,pm::Tracer&,pm::Camera&,pm::RGBColor*),unsigned_int&,unsigned_int_const&,std::reference_wrapper<pm::World>,std::reference_wrapper<pm::GlobalTrace>,std::reference_wrapper<pm::PinHole>,pm::RGBColor*>
              ((vector<std::thread,std::allocator<std::thread>> *)&threads,threadFunc,&local_19c,
               &numThreads,&local_170,&local_178,&local_180,(RGBColor **)&local_188);
    uVar1 = numThreads;
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    std::thread::join();
    uVar1 = numThreads;
  }
  std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Rendering time: ");
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar2,"ms\n");
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  savePbm("image.pbm",
          (RGBColor *)
          frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
          super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
          super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl,&world.viewplane_);
  std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"File save time: ");
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar2,"ms\n");
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  pm::World::~World(&world);
  std::unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_>::~unique_ptr(&frame);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Poor Man's Tracer \n\n" << std::flush;

	std::cout << "Setting up the scene...\n" << std::flush;
	auto startTime = std::chrono::high_resolution_clock::now();

	std::unique_ptr<pm::RGBColor[]> frame = std::make_unique<pm::RGBColor[]>(Width * Height);

	pm::World world;

#if CORNELL_BOX
	pm::GlobalTrace tracer;
	setupCornellBox(world);
#else
	setupWorld(world);
	pm::AreaLighting tracer;
#endif

	world.viewPlane().editPixelSize() = 0.004f;
	validateWorld(world);

	pm::PinHole camera;
#if CORNELL_BOX
	camera.editEye().set(278.0f, 273.0f, -800.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(278.0f, 273.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#else
	camera.editEye().set(0.0f, 2.0f, -8.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 2.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

#if 0
	//pm::Ortographic camera;
	world.viewPlane().setPixelSize(0.005f);

	pm::PinHole camera;
	camera.editEye().set(0.0f, 1.0f, -5.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 1.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

	const unsigned int numThreads = std::thread::hardware_concurrency();
	std::vector<std::thread> threads;
	threads.reserve(numThreads);

	auto endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Scene setting time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	std::cout << "Scene statistics: " << world.objects().size() << " objects, " << world.materials().size() << " materials, " <<
	             world.lights().size() << " lights, " << world.samplers().size() << " samplers\n" << std::flush;

	std::cout << "Rendering started";
	startTime = std::chrono::high_resolution_clock::now();

#if THREADING_TYPE == 0
	std::cout << " with one thread...\n" << std::flush;
	camera.renderScene(world, tracer, frame.get());
#elif THREADING_TYPE == 1
	std::cout << " with one thread (tiled)...\n" << std::flush;
	for (int i = 0; i < height; i += tileSize)
		for (int j = 0; j < width; j += tileSize)
			camera.renderScene(world, tracer, frame.get(), j, i, tileSize);
#elif THREADING_TYPE == 2
	std::cout << " with " << numThreads << " threads...\n" << std::flush;
	for (unsigned int i = 0; i < numThreads; i++)
		threads.emplace_back(threadFunc, i, numThreads, std::ref(world), std::ref(tracer), std::ref(camera), frame.get());
	for (unsigned int i = 0; i < numThreads; i++)
		threads[i].join();
#endif

	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Rendering time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	// Save output to PBM binary or ascii format
	startTime = std::chrono::high_resolution_clock::now();
	savePbm("image.pbm", frame.get(), world.viewPlane());
	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "File save time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	return EXIT_SUCCESS;
}